

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

void Xorshift128plus(uint64 *seed0,uint64 *seed1)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = *seed0;
  uVar1 = *seed1;
  *seed0 = uVar1;
  uVar2 = uVar2 << 0x17 ^ uVar2;
  *seed1 = uVar2 >> 0x11 ^ uVar1 >> 0x1a ^ uVar1 ^ uVar2;
  return;
}

Assistant:

void Xorshift128plus(uint64 *seed0, uint64 *seed1)
        {
            uint64 s1 = *seed0;
            uint64 s0 = *seed1;
            *seed0 = s0;
            s1 ^= s1 << 23;
            s1 ^= s1 >> 17;
            s1 ^= s0;
            s1 ^= s0 >> 26;
            *seed1 = s1;
        }